

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall mjs::interpreter::impl::scope::fixup(scope *this)

{
  gc_heap_ptr_untracked<mjs::object,_true>::fixup(&this->activation_,this->heap_);
  gc_heap_ptr_untracked<mjs::interpreter::impl::scope,_true>::fixup(&this->prev_,this->heap_);
  gc_heap_ptr_untracked<mjs::gc_vector<const_mjs::function_definition_*>,_true>::fixup
            (&this->active_functions_,this->heap_);
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::gc_heap_ptr_untracked<mjs::object,_false>_>,_true>::
  fixup(&this->active_function_values_,this->heap_);
  return;
}

Assistant:

void fixup() {
            activation_.fixup(heap_);
            prev_.fixup(heap_);
            active_functions_.fixup(heap_);
            active_function_values_.fixup(heap_);
        }